

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

int test_signed<long>(char *Name)

{
  return 0;
}

Assistant:

int test_signed(const char* Name)
{
  ALIGN(alignof(T)) uint8_t cst_minus10_le[sizeof(T)];
  ALIGN(alignof(T)) uint8_t cst_minus10_be[sizeof(T)];
  memset(&cst_minus10_le[0], 0xFF, sizeof(T));
  memset(&cst_minus10_be[0], 0xFF, sizeof(T));
  cst_minus10_le[0] = 0xF6;
  cst_minus10_be[sizeof(T)-1] = 0xF6;
  if (loadu_le<T>(cst_minus10_le) != -10) {
    std::cerr << Name << ": error loading LE signed integer!" << std::endl;
    return 1;
  }
  if (loadu_be<T>(cst_minus10_be) != -10) {
    std::cerr << Name << ": error loading BE signed integer!" << std::endl;
    return 1;
  }
  if (load_le<T>((T*) cst_minus10_le) != -10) {
    std::cerr << Name << ": error loading LE signed integer!" << std::endl;
    return 1;
  }
  if (load_be<T>((T*) cst_minus10_be) != -10) {
    std::cerr << Name << ": error loading BE signed integer!" << std::endl;
    return 1;
  }

  uint8_t tmp[sizeof(T)];
  storeu_le<T>(tmp, -10);
  if (memcmp(tmp, cst_minus10_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>((T*) tmp, -10);
  if (memcmp(tmp, cst_minus10_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }

  T tmp2;
  store_le<T>(&tmp2, -10);
  if (memcmp(&tmp2, cst_minus10_le, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing LE integer!" << std::endl;
    return 1;
  }
  storeu_be<T>(&tmp2, -10);
  if (memcmp(&tmp2, cst_minus10_be, sizeof(T)) != 0) {
    std::cerr << Name << ": error storing BE integer!" << std::endl;
    return 1;
  }
  return 0;
}